

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut2.c
# Opt level: O2

void Vec_IntIsOrdered(Vec_Int_t *vCut)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int i;
  
  iVar2 = Vec_IntEntry(vCut,0);
  i = 1;
  do {
    if (vCut->nSize <= i) {
      return;
    }
    iVar3 = Vec_IntEntry(vCut,i);
    i = i + 1;
    bVar1 = iVar2 < iVar3;
    iVar2 = iVar3;
  } while (bVar1);
  __assert_fail("Prev < Entry",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCut2.c"
                ,0xca,"void Vec_IntIsOrdered(Vec_Int_t *)");
}

Assistant:

void Vec_IntIsOrdered( Vec_Int_t * vCut )
{
    int i, Prev, Entry;
    Prev = Vec_IntEntry( vCut, 0 );
    Vec_IntForEachEntryStart( vCut, Entry, i, 1 )
    {
        assert( Prev < Entry );
        Prev = Entry;
    }
}